

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_service_handler.c
# Opt level: O0

int do_cmp_poke_v2(csp_cmp_message *cmp)

{
  __uint64_t _Var1;
  long in_RDI;
  int local_4;
  
  _Var1 = __bswap_64(*(__uint64_t *)(in_RDI + 2));
  *(__uint64_t *)(in_RDI + 2) = _Var1;
  if (*(byte *)(in_RDI + 10) < 0xc5) {
    if (csp_cmp_memwrite64_fnc == (csp_memwrite64_fnc_t)0x0) {
      local_4 = -0xb;
    }
    else {
      (*csp_cmp_memwrite64_fnc)
                (*(csp_memptr64_t *)(in_RDI + 2),(csp_memptr_t)(in_RDI + 0xb),
                 (size_t)*(undefined1 *)(in_RDI + 10));
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

static int do_cmp_poke_v2(struct csp_cmp_message * cmp) {

	cmp->poke_v2.vaddr = htobe64(cmp->poke_v2.vaddr);
	if (cmp->poke_v2.len > CSP_CMP_POKE_V2_MAX_LEN)
		return CSP_ERR_INVAL;

	if (!csp_cmp_memwrite64_fnc) {
		return CSP_ERR_DRIVER;
	}

	/* Extremely dangerous, you better know what you are doing */
	csp_cmp_memwrite64_fnc(cmp->poke_v2.vaddr, cmp->poke_v2.data, cmp->poke_v2.len);

	return CSP_ERR_NONE;
}